

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_i_refvec.h
# Opt level: O3

void __thiscall TNT::i_refvec<interval_*>::~i_refvec(i_refvec<interval_*> *this)

{
  int *piVar1;
  
  piVar1 = this->ref_count_;
  if ((piVar1 != (int *)0x0) && (*piVar1 = *piVar1 + -1, *piVar1 == 0)) {
    operator_delete(piVar1,4);
    if (this->data_ != (interval **)0x0) {
      operator_delete__(this->data_);
    }
    this->data_ = (interval **)0x0;
  }
  return;
}

Assistant:

i_refvec<T>::~i_refvec()
{
	if (ref_count_ != NULL)
	{
		(*ref_count_)--;

		if (*ref_count_ == 0)
		destroy();
	}
}